

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Edition *pEVar7;
  Edition *pEVar8;
  bool bVar9;
  
  iVar1 = this->m_editions_size;
  bVar9 = true;
  if (iVar1 <= this->m_editions_count) {
    iVar2 = 1;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    lVar6 = (long)iVar2 * 0x10;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = lVar6 + 8;
    }
    plVar3 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (plVar3 == (long *)0x0) {
      pEVar7 = (Edition *)0x0;
    }
    else {
      *plVar3 = (long)iVar2;
      pEVar7 = (Edition *)(plVar3 + 1);
      lVar4 = 0;
      pEVar8 = pEVar7;
      do {
        Edition::Edition(pEVar8);
        lVar4 = lVar4 + -0x10;
        pEVar8 = pEVar8 + 1;
      } while (-lVar4 != lVar6);
    }
    bVar9 = pEVar7 != (Edition *)0x0;
    if (bVar9) {
      iVar1 = this->m_editions_count;
      if (0 < (long)iVar1) {
        pEVar8 = this->m_editions;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)&pEVar7->m_atoms + lVar6) =
               *(undefined8 *)((long)&pEVar8->m_atoms + lVar6);
          *(undefined8 *)((long)&pEVar7->m_atoms_size + lVar6) =
               *(undefined8 *)((long)&pEVar8->m_atoms_size + lVar6);
          lVar6 = lVar6 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar6);
      }
      pEVar8 = this->m_editions;
      if (pEVar8 != (Edition *)0x0) {
        lVar6._0_4_ = pEVar8[-1].m_atoms_size;
        lVar6._4_4_ = pEVar8[-1].m_atoms_count;
        if (lVar6 != 0) {
          lVar6 = lVar6 << 4;
          do {
            Edition::~Edition((Edition *)((long)&pEVar8[-1].m_atoms + lVar6));
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
        }
        operator_delete__(&pEVar8[-1].m_atoms_size);
      }
      this->m_editions = pEVar7;
      this->m_editions_size = iVar2;
    }
  }
  return bVar9;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}